

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O0

ImportIterator * __thiscall axl::spy::ImportIterator::operator++(ImportIterator *this)

{
  ulong uVar1;
  size_t sVar2;
  ElfImportEnumeration *pEVar3;
  ImportIterator *in_RDI;
  ImportIteratorBase *in_stack_00000040;
  ImportIterator *in_stack_00000068;
  
  pEVar3 = rc::Ptr::operator_cast_to_ElfImportEnumeration_((Ptr *)&in_RDI->m_enumeration);
  if (pEVar3 != (ElfImportEnumeration *)0x0) {
    uVar1 = in_RDI->m_index;
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(&in_RDI->m_enumeration);
    sVar2 = pEVar3->m_pltRelCount;
    pEVar3 = rc::Ptr<axl::spy::ElfImportEnumeration>::operator->(&in_RDI->m_enumeration);
    if (uVar1 < sVar2 + pEVar3->m_gotRelCount) {
      in_RDI->m_index = in_RDI->m_index + 1;
      readRel(in_stack_00000068);
      return in_RDI;
    }
  }
  ImportIteratorBase::reset(in_stack_00000040);
  return in_RDI;
}

Assistant:

ImportIterator&
ImportIterator::operator ++ () {
	if (!m_enumeration ||
		m_index >= m_enumeration->m_pltRelCount + m_enumeration->m_gotRelCount) {
		reset();
		return *this;
	}

	m_index++;
	readRel();
	return *this;
}